

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void calc_mean_and_sd_weighted<float,int,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,vector<double,_std::allocator<double>_> *w
               )

{
  int *piVar1;
  double __x;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  ulong *puVar12;
  int *piVar13;
  long lVar14;
  double __z;
  double __z_00;
  double dVar15;
  double dVar16;
  double dVar17;
  
  lVar14 = (long)Xc_indptr[col_num];
  lVar6 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
    return;
  }
  puVar12 = ix_arr + st;
  puVar11 = ix_arr + end + 1;
  uVar8 = (long)puVar11 - (long)puVar12 >> 3;
  if (0 < (long)uVar8) {
    do {
      uVar7 = uVar8 >> 1;
      uVar10 = ~uVar7 + uVar8;
      uVar8 = uVar7;
      if ((puVar12 + uVar7 + 1)[-1] < (ulong)(long)Xc_ind[lVar14]) {
        puVar12 = puVar12 + uVar7 + 1;
        uVar8 = uVar10;
      }
    } while (0 < (long)uVar8);
  }
  dVar15 = 0.0;
  if (st <= end) {
    do {
      dVar15 = dVar15 + (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[ix_arr[st]];
      st = st + 1;
    } while (st <= end);
  }
  if ((puVar12 != puVar11) && (lVar6 != lVar14)) {
    iVar2 = Xc_ind[lVar6 + -1];
    pdVar4 = (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    __z_00 = 0.0;
    __z = 0.0;
    dVar16 = 0.0;
    while (uVar8 = *puVar12, uVar8 <= (ulong)(long)iVar2) {
      piVar1 = Xc_ind + lVar14;
      iVar3 = *piVar1;
      if (iVar3 == (int)uVar8) {
        __x = pdVar4[uVar8];
        if ((uint)ABS(Xc[lVar14]) < 0x7f800000) {
          dVar17 = (double)Xc[lVar14];
          bVar5 = dVar16 == 0.0;
          uVar8 = ~-(ulong)bVar5 & (ulong)__z_00;
          dVar16 = dVar16 + __x;
          __z_00 = fma(__x,(dVar17 - __z_00) / dVar16,__z_00);
          __z = fma(__x,(dVar17 - (double)(uVar8 | -(ulong)bVar5 & (ulong)dVar17)) *
                        (dVar17 - __z_00),__z);
        }
        else {
          dVar15 = dVar15 - __x;
        }
        if ((puVar12 == ix_arr + end) || (lVar14 == lVar6 + -1)) break;
        piVar13 = piVar1 + 1;
        puVar12 = puVar12 + 1;
        uVar8 = (long)Xc_ind + (lVar6 * 4 - (long)piVar13) >> 2;
        if (0 < (long)uVar8) {
          do {
            uVar7 = uVar8 >> 1;
            uVar10 = ~uVar7 + uVar8;
            uVar8 = uVar7;
            if ((ulong)(long)piVar13[uVar7] < *puVar12) {
              piVar13 = piVar13 + uVar7 + 1;
              uVar8 = uVar10;
            }
          } while (0 < (long)uVar8);
        }
LAB_00269a3e:
        lVar14 = (long)piVar13 - (long)Xc_ind >> 2;
      }
      else {
        if (iVar3 <= (int)uVar8) {
          piVar13 = piVar1 + 1;
          uVar7 = (long)Xc_ind + (lVar6 * 4 - (long)(piVar1 + 1)) >> 2;
          while (0 < (long)uVar7) {
            uVar10 = uVar7 >> 1;
            uVar9 = ~uVar10 + uVar7;
            uVar7 = uVar10;
            if ((ulong)(long)piVar13[uVar10] < uVar8) {
              piVar13 = piVar13 + uVar10 + 1;
              uVar7 = uVar9;
            }
          }
          goto LAB_00269a3e;
        }
        puVar12 = puVar12 + 1;
        uVar8 = (long)puVar11 - (long)puVar12 >> 3;
        while (0 < (long)uVar8) {
          uVar7 = uVar8 >> 1;
          uVar10 = ~uVar7 + uVar8;
          uVar8 = uVar7;
          if ((puVar12 + uVar7 + 1)[-1] < (ulong)(long)iVar3) {
            puVar12 = puVar12 + uVar7 + 1;
            uVar8 = uVar10;
          }
        }
      }
      if ((puVar12 == puVar11) || (lVar14 == lVar6)) break;
    }
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      if (dVar16 < dVar15) {
        __z = __z + (1.0 - dVar16 / dVar15) * dVar16 * __z_00 * __z_00;
        __z_00 = __z_00 * (dVar16 / dVar15);
      }
      *x_mean = __z_00;
      dVar15 = SQRT(__z / dVar15);
      goto LAB_00269a87;
    }
  }
  *x_mean = 0.0;
  dVar15 = 0.0;
LAB_00269a87:
  *x_sd = dVar15;
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}